

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O0

void double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  double absolute_tolerance;
  double *in_stack_fffffffffffffd88;
  double local_268;
  value_type local_260;
  size_type local_258;
  double local_248;
  value_type local_240;
  size_type local_238;
  double local_228;
  value_type local_220;
  size_type local_218;
  double local_208;
  value_type local_200;
  size_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  size_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  size_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  size_type local_198;
  double local_188;
  value_type local_180;
  size_type local_178;
  double local_168;
  value_type local_160;
  size_type local_158;
  double local_148;
  value_type local_140;
  size_type local_138;
  double local_128;
  value_type local_120;
  size_type local_118;
  double local_108;
  value_type local_100;
  size_type local_f8;
  double local_e8;
  value_type local_e0;
  size_type local_d8;
  double local_c8;
  value_type local_c0;
  undefined1 local_b8 [8];
  regression<double,_4UL> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)
             &filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count,1e-05,absolute_tolerance);
  trial::online::interim::regression<double,_4UL>::regression((regression<double,_4UL> *)local_b8);
  trial::online::interim::regression<double,_4UL>::push((regression<double,_4UL> *)local_b8,1.0,1.0)
  ;
  local_c0 = trial::online::interim::regression<double,_4UL>::slope
                       ((regression<double,_4UL> *)local_b8);
  local_c8 = 0.0;
  local_d8 = filter.y_moment.
             super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.passive
             .member.count;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15a,0x10c98e,(char *)&local_c0,&local_c8,in_stack_fffffffffffffd88,
             predicate_12);
  local_e0 = trial::online::interim::regression<double,_4UL>::at
                       ((regression<double,_4UL> *)local_b8,0.0);
  local_e8 = 1.0;
  local_f8 = filter.y_moment.
             super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.passive
             .member.count;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15b,0x10c98e,(char *)&local_e0,&local_e8,in_stack_fffffffffffffd88,
             predicate_11);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,10.0,10.0);
  local_100 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_108 = 1.0;
  local_118 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15e,0x10c98e,(char *)&local_100,&local_108,in_stack_fffffffffffffd88,
             predicate_10);
  local_120 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_128 = 0.0;
  local_138 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x15f,0x10c98e,(char *)&local_120,&local_128,in_stack_fffffffffffffd88,
             predicate_09);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,100.0,100.0);
  local_140 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_148 = 1.0;
  local_158 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x162,0x10c98e,(char *)&local_140,&local_148,in_stack_fffffffffffffd88,
             predicate_08);
  local_160 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_168 = 0.0;
  local_178 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x163,0x10c98e,(char *)&local_160,&local_168,in_stack_fffffffffffffd88,
             predicate_07);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,1000.0,1000.0);
  local_180 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_188 = 1.0;
  local_198 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x166,0x10c98e,(char *)&local_180,&local_188,in_stack_fffffffffffffd88,
             predicate_06);
  local_1a0 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_1a8 = 0.0;
  local_1b8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x167,0x10c98e,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffd88,
             predicate_05);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,10000.0,10000.0);
  local_1c0 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_1c8 = 1.0;
  local_1d8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x16c,0x10c98e,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffd88,
             predicate_04);
  local_1e0 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_1e8 = 0.0;
  local_1f8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x16d,0x10c98e,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffd88,
             predicate_03);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,100000.0,100000.0);
  local_200 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_208 = 1.0;
  local_218 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x170,0x10c98e,(char *)&local_200,&local_208,in_stack_fffffffffffffd88,
             predicate_02);
  local_220 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_228 = 0.0;
  local_238 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x171,0x10c98e,(char *)&local_220,&local_228,in_stack_fffffffffffffd88,
             predicate_01);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,1000000.0,1000000.0);
  local_240 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_248 = 1.0;
  local_258 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x174,0x10c98e,(char *)&local_240,&local_248,in_stack_fffffffffffffd88,
             predicate_00);
  local_260 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_268 = 0.0;
  predicate.absolute = tolerance.relative;
  predicate.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x175,0x10c98e,(char *)&local_260,&local_268,
             (double *)
             filter.y_moment.
             super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.passive
             .member.count,predicate);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    interim::regression<double, 4> filter;

    filter.push(1e0, 1e0);
    TRIAL_TEST_WITH(filter.slope(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 1.0, tolerance);

    filter.push(1e1, 1e1);
    TRIAL_TEST_WITH(filter.slope(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);

    filter.push(1e2, 1e2);
    TRIAL_TEST_WITH(filter.slope(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);

    filter.push(1e3, 1e3);
    TRIAL_TEST_WITH(filter.slope(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);

    // Window full

    filter.push(1e4, 1e4);
    TRIAL_TEST_WITH(filter.slope(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);

    filter.push(1e5, 1e5);
    TRIAL_TEST_WITH(filter.slope(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);

    filter.push(1e6, 1e6);
    TRIAL_TEST_WITH(filter.slope(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 0.0, tolerance);
}